

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLSSetMassPreconditioner
              (void *arkode_mem,ARKLsMassPrecSetupFn psetup,ARKLsMassPrecSolveFn psolve)

{
  int iVar1;
  char *msgfmt;
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSSetMassPreconditioner",&ark_mem,&arkls_mem);
  if (iVar1 == 0) {
    if (arkls_mem->LS->ops->setpreconditioner ==
        (_func_int_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) {
      msgfmt = "SUNLinearSolver object does not support user-supplied preconditioning";
      iVar1 = -3;
    }
    else {
      arkls_mem->pset = psetup;
      arkls_mem->psolve = psolve;
      if (psetup != (ARKLsMassPrecSetupFn)0x0) {
        psetup = arkLsMPSetup;
      }
      if (psolve != (ARKLsMassPrecSolveFn)0x0) {
        psolve = arkLsMPSolve;
      }
      iVar1 = SUNLinSolSetPreconditioner
                        (arkls_mem->LS,ark_mem,(SUNPSetupFn)psetup,(SUNPSolveFn)psolve);
      if (iVar1 == 0) {
        return 0;
      }
      msgfmt = "Error in calling SUNLinSolSetPreconditioner";
      iVar1 = -0xc;
    }
    arkProcessError(ark_mem,iVar1,"ARKLS","arkLSSetMassPreconditioner",msgfmt);
  }
  return iVar1;
}

Assistant:

int arkLSSetMassPreconditioner(void *arkode_mem,
                               ARKLsMassPrecSetupFn psetup,
                               ARKLsMassPrecSolveFn psolve)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  SUNPSetupFn     arkls_mpsetup;
  SUNPSolveFn     arkls_mpsolve;
  int          retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSSetMassPreconditioner",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* issue error if LS object does not allow user-supplied preconditioning */
  if (arkls_mem->LS->ops->setpreconditioner == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLSSetMassPreconditioner",
                    "SUNLinearSolver object does not support user-supplied preconditioning");
    return(ARKLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routines in ARKLs interface */
  arkls_mem->pset   = psetup;
  arkls_mem->psolve = psolve;

  /* notify linear solver to call ARKLs interface routines */
  arkls_mpsetup = (psetup == NULL) ? NULL : arkLsMPSetup;
  arkls_mpsolve = (psolve == NULL) ? NULL : arkLsMPSolve;
  retval = SUNLinSolSetPreconditioner(arkls_mem->LS, ark_mem,
                                      arkls_mpsetup, arkls_mpsolve);
  if (retval != SUNLS_SUCCESS) {
    arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, "ARKLS",
                    "arkLSSetMassPreconditioner",
                    "Error in calling SUNLinSolSetPreconditioner");
    return(ARKLS_SUNLS_FAIL);
  }

  return(ARKLS_SUCCESS);
}